

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

NeuralNetworkClassifier *
buildBasicNeuralNetworkClassifierModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringClassLabels,vector<long,_std::allocator<long>_> *intClassLabels,bool includeBias)

{
  RepeatedField<long> *pRVar1;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  uint uVar2;
  pointer pbVar3;
  pointer pbVar4;
  ulong uVar5;
  Rep *pRVar6;
  pointer pbVar7;
  pointer pcVar8;
  size_t __n;
  undefined4 uVar9;
  Model *pMVar10;
  RepeatedPtrFieldBase *this_00;
  int iVar11;
  int iVar12;
  ModelDescription *pMVar13;
  FeatureType *pFVar14;
  ArrayFeatureType *pAVar15;
  long *plVar16;
  StringFeatureType *pSVar17;
  DictionaryFeatureType *this_01;
  NeuralNetworkClassifier *pNVar18;
  StringVector *pSVar19;
  string *psVar20;
  Int64Vector *pIVar21;
  NeuralNetworkLayer *pNVar22;
  LayerUnion LVar23;
  WeightParams *pWVar24;
  NeuralNetworkLayer *pNVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar26;
  SoftmaxLayerParams *pSVar27;
  FeatureDescription *pFVar28;
  ModelDescription *pMVar29;
  undefined8 *puVar30;
  Arena *pAVar31;
  pointer pbVar32;
  uint64_t uVar33;
  void **ppvVar34;
  char cVar35;
  long lVar36;
  undefined7 in_register_00000031;
  Arena *pAVar37;
  undefined7 in_register_00000089;
  long tmp_1;
  uint64_t uVar38;
  long lVar39;
  uint64_t uVar40;
  long tmp;
  void *pvVar41;
  initializer_list<long> __l;
  vector<long,_std::allocator<long>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> className;
  allocator_type local_13a;
  less<long> local_139;
  NeuralNetworkClassifier *local_138;
  undefined4 local_12c;
  NeuralNetworkLayer *local_128;
  Model *local_120;
  undefined4 local_114;
  vector<long,_std::allocator<long>_> *local_110;
  FeatureDescription local_108;
  RepeatedPtrFieldBase *local_d0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_60;
  
  pbVar3 = (stringClassLabels->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (stringClassLabels->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pMVar13 = m->description_;
  local_128 = (NeuralNetworkLayer *)stringClassLabels;
  local_110 = intClassLabels;
  if (pMVar13 == (ModelDescription *)0x0) {
    uVar5 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    pMVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar37);
    m->description_ = pMVar13;
  }
  pRVar6 = (pMVar13->input_).super_RepeatedPtrFieldBase.rep_;
  local_120 = m;
  if (pRVar6 == (Rep *)0x0) {
LAB_001de2db:
    pFVar28 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar13->input_).super_RepeatedPtrFieldBase.arena_);
    local_138 = (NeuralNetworkClassifier *)
                google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                          (&(pMVar13->input_).super_RepeatedPtrFieldBase,pFVar28);
  }
  else {
    iVar12 = (pMVar13->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar12) goto LAB_001de2db;
    (pMVar13->input_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
    local_138 = (NeuralNetworkClassifier *)pRVar6->elements[iVar12];
  }
  pFVar14 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar14,(Arena *)0x0,false);
  local_114 = (undefined4)CONCAT71(in_register_00000089,includeBias);
  local_12c = (undefined4)CONCAT71(in_register_00000031,isUpdatable);
  if (pFVar14->_oneof_case_[0] == 5) {
    pAVar15 = (pFVar14->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar14);
    pFVar14->_oneof_case_[0] = 5;
    uVar5 = (pFVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    pAVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar37);
    (pFVar14->Type_).multiarraytype_ = pAVar15;
  }
  pRVar1 = &pAVar15->shape_;
  iVar12 = inTensorAttr->dimension;
  uVar2 = (pAVar15->shape_).current_size_;
  if (uVar2 == (pAVar15->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar16 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar16[uVar2] = (long)iVar12;
  }
  else {
    plVar16 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar16[uVar2] = (long)iVar12;
  }
  pNVar18 = local_138;
  (pAVar15->shape_).current_size_ = uVar2 + 1;
  pAVar15->datatype_ = 0x10040;
  puVar30 = (undefined8 *)(*(ulong *)((long)local_138 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)local_138 + 8) & 1) != 0) {
    puVar30 = (undefined8 *)*puVar30;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)local_138 + 0x10),inTensorAttr->name,puVar30);
  pAVar37 = (Arena *)(*(ulong *)((long)pNVar18 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pNVar18 + 8) & 1) != 0) {
    pAVar37 = *(Arena **)pAVar37;
  }
  if ((pAVar37 == (Arena *)0x0) && (*(long **)((long)pNVar18 + 0x20) != (long *)0x0)) {
    (**(code **)(**(long **)((long)pNVar18 + 0x20) + 8))();
  }
  uVar5 = (pFVar14->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 2) == 0) {
    pAVar31 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar31 = *(Arena **)pAVar31;
    }
  }
  else {
    pAVar31 = (Arena *)0x0;
  }
  if (pAVar37 != pAVar31) {
    pFVar14 = (FeatureType *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (pAVar37,(MessageLite *)pFVar14,pAVar31);
  }
  pMVar10 = local_120;
  *(FeatureType **)((long)pNVar18 + 0x20) = pFVar14;
  pMVar13 = local_120->description_;
  if (pMVar13 == (ModelDescription *)0x0) {
    uVar5 = (local_120->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    pMVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar37);
    pMVar10->description_ = pMVar13;
  }
  pRVar6 = (pMVar13->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_001de485:
    pFVar28 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar13->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar41 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar13->output_).super_RepeatedPtrFieldBase,pFVar28);
  }
  else {
    iVar12 = (pMVar13->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar12) goto LAB_001de485;
    (pMVar13->output_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
    pvVar41 = pRVar6->elements[iVar12];
  }
  pFVar14 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar14,(Arena *)0x0,false);
  if (pbVar4 == pbVar3) {
    if (pFVar14->_oneof_case_[0] != 1) {
      CoreML::Specification::FeatureType::clear_Type(pFVar14);
      pFVar14->_oneof_case_[0] = 1;
      uVar5 = (pFVar14->super_MessageLite)._internal_metadata_.ptr_;
      pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar37 = *(Arena **)pAVar37;
      }
      pSVar17 = (StringFeatureType *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64FeatureType>
                          (pAVar37);
      goto LAB_001de522;
    }
  }
  else if (pFVar14->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar14);
    pFVar14->_oneof_case_[0] = 3;
    uVar5 = (pFVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    pSVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringFeatureType>
                        (pAVar37);
LAB_001de522:
    (pFVar14->Type_).stringtype_ = pSVar17;
  }
  puVar30 = (undefined8 *)(*(ulong *)((long)pvVar41 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar41 + 8) & 1) != 0) {
    puVar30 = (undefined8 *)*puVar30;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar41 + 0x10),"predictedClass",puVar30);
  pAVar37 = (Arena *)(*(ulong *)((long)pvVar41 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar41 + 8) & 1) != 0) {
    pAVar37 = *(Arena **)pAVar37;
  }
  if ((pAVar37 == (Arena *)0x0) && (*(long **)((long)pvVar41 + 0x20) != (long *)0x0)) {
    (**(code **)(**(long **)((long)pvVar41 + 0x20) + 8))();
  }
  uVar5 = (pFVar14->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 2) == 0) {
    pAVar31 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar31 = *(Arena **)pAVar31;
    }
  }
  else {
    pAVar31 = (Arena *)0x0;
  }
  if (pAVar37 != pAVar31) {
    pFVar14 = (FeatureType *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (pAVar37,(MessageLite *)pFVar14,pAVar31);
  }
  pMVar10 = local_120;
  *(FeatureType **)((long)pvVar41 + 0x20) = pFVar14;
  pMVar13 = local_120->description_;
  if (pMVar13 == (ModelDescription *)0x0) {
    uVar5 = (local_120->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    pMVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar37);
    pMVar10->description_ = pMVar13;
  }
  pRVar6 = (pMVar13->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_001de5ef:
    pFVar28 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar13->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar41 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar13->output_).super_RepeatedPtrFieldBase,pFVar28);
  }
  else {
    iVar12 = (pMVar13->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar12) goto LAB_001de5ef;
    (pMVar13->output_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
    pvVar41 = pRVar6->elements[iVar12];
  }
  pFVar14 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar14,(Arena *)0x0,false);
  if (pFVar14->_oneof_case_[0] == 6) {
    this_01 = (pFVar14->Type_).dictionarytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar14);
    pFVar14->_oneof_case_[0] = 6;
    uVar5 = (pFVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    this_01 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::DictionaryFeatureType>(pAVar37);
    (pFVar14->Type_).dictionarytype_ = this_01;
  }
  if (pbVar4 == pbVar3) {
    if (this_01->_oneof_case_[0] != 1) {
      CoreML::Specification::DictionaryFeatureType::clear_KeyType(this_01);
      this_01->_oneof_case_[0] = 1;
      uVar5 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
      pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar37 = *(Arena **)pAVar37;
      }
      pSVar17 = (StringFeatureType *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64FeatureType>
                          (pAVar37);
      goto LAB_001de6c5;
    }
  }
  else if (this_01->_oneof_case_[0] != 2) {
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(this_01);
    this_01->_oneof_case_[0] = 2;
    uVar5 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    pSVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringFeatureType>
                        (pAVar37);
LAB_001de6c5:
    (this_01->KeyType_).stringkeytype_ = pSVar17;
  }
  puVar30 = (undefined8 *)(*(ulong *)((long)pvVar41 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar41 + 8) & 1) != 0) {
    puVar30 = (undefined8 *)*puVar30;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar41 + 0x10),"classProbabilities",puVar30);
  pAVar37 = (Arena *)(*(ulong *)((long)pvVar41 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar41 + 8) & 1) != 0) {
    pAVar37 = *(Arena **)pAVar37;
  }
  if ((pAVar37 == (Arena *)0x0) && (*(long **)((long)pvVar41 + 0x20) != (long *)0x0)) {
    (**(code **)(**(long **)((long)pvVar41 + 0x20) + 8))();
  }
  uVar5 = (pFVar14->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 2) == 0) {
    pAVar31 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar31 = *(Arena **)pAVar31;
    }
  }
  else {
    pAVar31 = (Arena *)0x0;
  }
  if (pAVar37 != pAVar31) {
    pFVar14 = (FeatureType *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (pAVar37,(MessageLite *)pFVar14,pAVar31);
  }
  pMVar10 = local_120;
  *(FeatureType **)((long)pvVar41 + 0x20) = pFVar14;
  pMVar13 = local_120->description_;
  if (pMVar13 == (ModelDescription *)0x0) {
    uVar5 = (local_120->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    pMVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar37);
    pMVar10->description_ = pMVar13;
  }
  uVar5 = (pMVar13->super_MessageLite)._internal_metadata_.ptr_;
  puVar30 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar30 = (undefined8 *)*puVar30;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pMVar13->predictedfeaturename_,"predictedClass",puVar30);
  pMVar13 = pMVar10->description_;
  if (pMVar13 == (ModelDescription *)0x0) {
    uVar5 = (pMVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    pMVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar37);
    pMVar10->description_ = pMVar13;
  }
  uVar5 = (pMVar13->super_MessageLite)._internal_metadata_.ptr_;
  puVar30 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar30 = (undefined8 *)*puVar30;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pMVar13->predictedprobabilitiesname_,"classProbabilities",puVar30);
  if (pMVar10->_oneof_case_[0] == 0x193) {
    pNVar18 = (pMVar10->Type_).neuralnetworkclassifier_;
  }
  else {
    CoreML::Specification::Model::clear_Type(pMVar10);
    pMVar10->_oneof_case_[0] = 0x193;
    uVar5 = (pMVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    pNVar18 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::NeuralNetworkClassifier>(pAVar37);
    (pMVar10->Type_).neuralnetworkclassifier_ = pNVar18;
  }
  if (pbVar4 == pbVar3) {
    pbVar7 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_110->super__Vector_base<long,_std::allocator<long>_>)->_M_impl).
             super__Vector_impl_data._M_finish;
    for (pbVar32 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_110->super__Vector_base<long,_std::allocator<long>_>)->_M_impl).
                   super__Vector_impl_data._M_start; local_138 = pNVar18, pbVar32 != pbVar7;
        pbVar32 = (pointer)&pbVar32->_M_string_length) {
      pcVar8 = (pbVar32->_M_dataplus)._M_p;
      if (pNVar18->_oneof_case_[0] == 0x65) {
        pIVar21 = (pNVar18->ClassLabels_).int64classlabels_;
      }
      else {
        CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels(pNVar18);
        pNVar18->_oneof_case_[0] = 0x65;
        uVar5 = (pNVar18->super_MessageLite)._internal_metadata_.ptr_;
        pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
        if ((uVar5 & 1) != 0) {
          pAVar37 = *(Arena **)pAVar37;
        }
        pIVar21 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                            (pAVar37);
        (pNVar18->ClassLabels_).int64classlabels_ = pIVar21;
      }
      pRVar1 = &pIVar21->vector_;
      uVar2 = (pIVar21->vector_).current_size_;
      if (uVar2 == (pIVar21->vector_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
        plVar16 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar16[uVar2] = (long)pcVar8;
      }
      else {
        plVar16 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar16[uVar2] = (long)pcVar8;
      }
      pRVar1->current_size_ = uVar2 + 1;
      pNVar18 = local_138;
    }
  }
  else {
    pbVar32 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_128->super_MessageLite)->_M_impl).super__Vector_impl_data._M_start;
    pbVar7 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_128->super_MessageLite)->_M_impl).super__Vector_impl_data._M_finish;
    local_138 = pNVar18;
    if (pbVar32 != pbVar7) {
      do {
        pcVar8 = (pbVar32->_M_dataplus)._M_p;
        local_108.super_MessageLite._vptr_MessageLite = (_func_int **)&local_108.name_;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,pcVar8,pcVar8 + pbVar32->_M_string_length);
        if (pNVar18->_oneof_case_[0] == 100) {
          pSVar19 = (pNVar18->ClassLabels_).stringclasslabels_;
        }
        else {
          CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels(pNVar18);
          pNVar18->_oneof_case_[0] = 100;
          uVar5 = (pNVar18->super_MessageLite)._internal_metadata_.ptr_;
          pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
          if ((uVar5 & 1) != 0) {
            pAVar37 = *(Arena **)pAVar37;
          }
          pSVar19 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                              (pAVar37);
          (pNVar18->ClassLabels_).stringclasslabels_ = pSVar19;
        }
        pRVar6 = (pSVar19->vector_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar6 == (Rep *)0x0) {
LAB_001de8c2:
          pbVar26 = google::protobuf::Arena::Create<std::__cxx11::string>
                              ((pSVar19->vector_).super_RepeatedPtrFieldBase.arena_);
          psVar20 = (string *)
                    google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                              (&(pSVar19->vector_).super_RepeatedPtrFieldBase,pbVar26);
        }
        else {
          iVar12 = (pSVar19->vector_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar6->allocated_size <= iVar12) goto LAB_001de8c2;
          (pSVar19->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
          psVar20 = (string *)pRVar6->elements[iVar12];
        }
        std::__cxx11::string::_M_assign(psVar20);
        if ((ArenaStringPtr *)local_108.super_MessageLite._vptr_MessageLite != &local_108.name_) {
          operator_delete(local_108.super_MessageLite._vptr_MessageLite,
                          (long)local_108.name_.tagged_ptr_.ptr_ + 1);
        }
        pbVar32 = pbVar32 + 1;
      } while (pbVar32 != pbVar7);
    }
  }
  this = &pNVar18->layers_;
  pRVar6 = (pNVar18->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_001de9e4:
    pNVar25 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pNVar25 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this->super_RepeatedPtrFieldBase,pNVar25);
  }
  else {
    iVar12 = (pNVar18->layers_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar12) goto LAB_001de9e4;
    (pNVar18->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
    pNVar25 = (NeuralNetworkLayer *)pRVar6->elements[iVar12];
  }
  uVar5 = (pNVar25->super_MessageLite)._internal_metadata_.ptr_;
  puVar30 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar30 = (undefined8 *)*puVar30;
  }
  local_d0 = &this->super_RepeatedPtrFieldBase;
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pNVar25->name_,"inner_product",puVar30);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar25,inTensorAttr->name);
  pRVar6 = (pNVar25->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_001dea62:
    pbVar26 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar25->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar41 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar25->output_).super_RepeatedPtrFieldBase,pbVar26);
  }
  else {
    iVar12 = (pNVar25->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar12) goto LAB_001dea62;
    (pNVar25->output_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
    pvVar41 = pRVar6->elements[iVar12];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar41,0,*(char **)((long)pvVar41 + 8),0x39c142);
  pNVar22 = local_128;
  if (pbVar4 == pbVar3) {
    pNVar22 = (NeuralNetworkLayer *)local_110;
  }
  pbVar32 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&((vector<long,_std::allocator<long>_> *)pNVar22)->
                  super__Vector_base<long,_std::allocator<long>_>)->_M_impl).super__Vector_impl_data
            ._M_start;
  pbVar7 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&((vector<long,_std::allocator<long>_> *)pNVar22)->
                 super__Vector_base<long,_std::allocator<long>_>)->_M_impl).super__Vector_impl_data.
           _M_finish;
  uVar38 = (long)pbVar7 - (long)pbVar32 >> (pbVar4 != pbVar3) * '\x02' + 3;
  iVar12 = inTensorAttr->dimension;
  if (pNVar25->_oneof_case_[0] == 0x8c) {
    LVar23 = pNVar25->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar25);
    pNVar25->_oneof_case_[0] = 0x8c;
    uVar5 = (pNVar25->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    LVar23.innerproduct_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>
                   (pAVar37);
    (pNVar25->layer_).innerproduct_ = (InnerProductLayerParams *)LVar23;
  }
  (LVar23.innerproduct_)->inputchannels_ = (long)iVar12;
  (LVar23.splitnd_)->axis_ = uVar38;
  pWVar24 = (WeightParams *)((LVar23.activation_)->NonlinearityType_).parametricsoftplus_;
  if (pWVar24 == (WeightParams *)0x0) {
    uVar5 = ((LVar23.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    pWVar24 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                        (pAVar37);
    ((LVar23.activation_)->NonlinearityType_).parametricsoftplus_ =
         (ActivationParametricSoftplus *)pWVar24;
  }
  local_108.super_MessageLite._vptr_MessageLite =
       (_func_int **)((ulong)local_108.super_MessageLite._vptr_MessageLite & 0xffffffff00000000);
  local_128 = pNVar25;
  google::protobuf::RepeatedField<float>::Resize
            (&pWVar24->floatvalue_,iVar12 * (int)uVar38,(float *)&local_108);
  if (iVar12 != 0) {
    pvVar41 = (pWVar24->floatvalue_).arena_or_elements_;
    uVar40 = 0;
    do {
      if (pbVar7 != pbVar32) {
        uVar33 = 0;
        do {
          iVar11 = rand();
          *(float *)((long)pvVar41 + uVar33 * 4) = (float)iVar11 * 4.656613e-10;
          uVar33 = uVar33 + 1;
        } while (uVar38 != uVar33);
      }
      uVar40 = uVar40 + 1;
      pvVar41 = (void *)((long)pvVar41 + uVar38 * 4);
    } while (uVar40 != (long)iVar12);
  }
  pMVar10 = local_120;
  cVar35 = (char)local_114;
  if (cVar35 != '\0') {
    (LVar23.innerproduct_)->hasbias_ = true;
    pWVar24 = (LVar23.innerproduct_)->bias_;
    if (pWVar24 == (WeightParams *)0x0) {
      uVar5 = ((LVar23.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar37 = *(Arena **)pAVar37;
      }
      pWVar24 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar37);
      (LVar23.innerproduct_)->bias_ = pWVar24;
    }
    local_108.super_MessageLite._vptr_MessageLite =
         (_func_int **)((ulong)local_108.super_MessageLite._vptr_MessageLite & 0xffffffff00000000);
    google::protobuf::RepeatedField<float>::Resize
              (&pWVar24->floatvalue_,(int)uVar38,(float *)&local_108);
    if (pbVar7 != pbVar32) {
      pvVar41 = (pWVar24->floatvalue_).arena_or_elements_;
      uVar40 = 0;
      do {
        iVar12 = rand();
        *(float *)((long)pvVar41 + uVar40 * 4) = (float)iVar12 * 4.656613e-10;
        uVar40 = uVar40 + 1;
      } while (uVar38 != uVar40);
    }
  }
  this_00 = local_d0;
  pRVar6 = (local_138->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_001dec6c:
    pNVar25 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        (local_d0->arena_);
    pNVar25 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper(this_00,pNVar25);
  }
  else {
    iVar12 = (local_138->layers_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar12) goto LAB_001dec6c;
    (local_138->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
    pNVar25 = (NeuralNetworkLayer *)pRVar6->elements[iVar12];
  }
  uVar9 = local_12c;
  uVar5 = (pNVar25->super_MessageLite)._internal_metadata_.ptr_;
  puVar30 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar30 = (undefined8 *)*puVar30;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar25->name_,"softmax",puVar30);
  pRVar6 = (pNVar25->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_001decd0:
    pbVar26 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar25->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar41 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar25->input_).super_RepeatedPtrFieldBase,pbVar26);
  }
  else {
    iVar12 = (pNVar25->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar12) goto LAB_001decd0;
    (pNVar25->input_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
    pvVar41 = pRVar6->elements[iVar12];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar41,0,*(char **)((long)pvVar41 + 8),0x39c142);
  pRVar6 = (pNVar25->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 != (Rep *)0x0) {
    iVar12 = (pNVar25->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar12 < pRVar6->allocated_size) {
      (pNVar25->output_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
      pvVar41 = pRVar6->elements[iVar12];
      goto LAB_001ded3d;
    }
  }
  pbVar26 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar25->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar41 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar25->output_).super_RepeatedPtrFieldBase,pbVar26);
LAB_001ded3d:
  std::__cxx11::string::_M_replace((ulong)pvVar41,0,*(char **)((long)pvVar41 + 8),0x39c155);
  if (pNVar25->_oneof_case_[0] != 0xaf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar25);
    pNVar25->_oneof_case_[0] = 0xaf;
    uVar5 = (pNVar25->super_MessageLite)._internal_metadata_.ptr_;
    pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar37 = *(Arena **)pAVar37;
    }
    pSVar27 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SoftmaxLayerParams>
                        (pAVar37);
    (pNVar25->layer_).softmax_ = pSVar27;
  }
  if ((char)uVar9 != '\0') {
    pMVar10->isupdatable_ = true;
    local_128->isupdatable_ = true;
    pWVar24 = (WeightParams *)((LVar23.activation_)->NonlinearityType_).linear_;
    if (pWVar24 == (WeightParams *)0x0) {
      uVar5 = ((LVar23.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar37 = *(Arena **)pAVar37;
      }
      pWVar24 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar37);
      ((LVar23.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar24;
    }
    pWVar24->isupdatable_ = true;
    if (cVar35 != '\0') {
      pWVar24 = (LVar23.innerproduct_)->bias_;
      if (pWVar24 == (WeightParams *)0x0) {
        uVar5 = ((LVar23.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
        pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
        if ((uVar5 & 1) != 0) {
          pAVar37 = *(Arena **)pAVar37;
        }
        pWVar24 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                            (pAVar37);
        (LVar23.innerproduct_)->bias_ = pWVar24;
      }
      pWVar24->isupdatable_ = true;
    }
    pNVar18 = local_138;
    addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetworkClassifier>
              (pMVar10,local_138,"cross_entropy_loss","scoreVector","target");
    addLearningRate<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar18,kSgdOptimizer,0.699999988079071,0.0,1.0);
    local_108.name_.tagged_ptr_.ptr_ =
         (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(void *)0x40;
    local_108.shortdescription_.tagged_ptr_.ptr_ =
         (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(void *)0x80;
    local_108.super_MessageLite._vptr_MessageLite = (_func_int **)0x10;
    local_108.super_MessageLite._internal_metadata_.ptr_ = 0x20;
    __l._M_len = 4;
    __l._M_array = (iterator)&local_108;
    std::set<long,_std::less<long>,_std::allocator<long>_>::set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_60,__l,&local_139,
               &local_13a);
    addMiniBatchSize<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar18,kSgdOptimizer,0x20,1,100,
               (set<long,_std::less<long>,_std::allocator<long>_> *)&local_60);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_60);
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl._0_8_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    addEpochs<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar18,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_98);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_98);
    local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_c8._M_impl.super__Rb_tree_header._M_header;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._M_impl._0_8_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
    addShuffleAndSeed<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar18,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_c8)
    ;
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_c8);
    pMVar13 = pMVar10->description_;
    if (pMVar13 == (ModelDescription *)0x0) {
      uVar5 = (pMVar10->super_MessageLite)._internal_metadata_.ptr_;
      pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar37 = *(Arena **)pAVar37;
      }
      pMVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                          (pAVar37);
      pMVar10->description_ = pMVar13;
    }
    google::protobuf::internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              (&(pMVar13->traininginput_).super_RepeatedPtrFieldBase);
    pMVar13 = pMVar10->description_;
    pMVar29 = pMVar13;
    if (pMVar13 == (ModelDescription *)0x0) {
      pMVar29 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar6 = (pMVar29->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar34 = pRVar6->elements;
    if (pRVar6 == (Rep *)0x0) {
      ppvVar34 = (void **)0x0;
    }
    lVar39 = (long)(pMVar29->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar39 != 0) {
      lVar36 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  (&local_108,*(FeatureDescription **)((long)ppvVar34 + lVar36));
        pMVar13 = pMVar10->description_;
        if (pMVar13 == (ModelDescription *)0x0) {
          uVar5 = (pMVar10->super_MessageLite)._internal_metadata_.ptr_;
          pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
          if ((uVar5 & 1) != 0) {
            pAVar37 = *(Arena **)pAVar37;
          }
          pMVar13 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::ModelDescription>(pAVar37);
          pMVar10->description_ = pMVar13;
        }
        pRVar6 = (pMVar13->traininginput_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar6 == (Rep *)0x0) {
LAB_001df00e:
          pFVar28 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                              ((pMVar13->traininginput_).super_RepeatedPtrFieldBase.arena_);
          pFVar28 = (FeatureDescription *)
                    google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                              (&(pMVar13->traininginput_).super_RepeatedPtrFieldBase,pFVar28);
        }
        else {
          iVar12 = (pMVar13->traininginput_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar6->allocated_size <= iVar12) goto LAB_001df00e;
          (pMVar13->traininginput_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
          pFVar28 = (FeatureDescription *)pRVar6->elements[iVar12];
        }
        CoreML::Specification::FeatureDescription::CopyFrom(pFVar28,&local_108);
        CoreML::Specification::FeatureDescription::~FeatureDescription(&local_108);
        lVar36 = lVar36 + 8;
      } while (lVar39 * 8 != lVar36);
      pMVar13 = pMVar10->description_;
    }
    if (pMVar13 == (ModelDescription *)0x0) {
      pMVar13 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar6 = (pMVar13->output_).super_RepeatedPtrFieldBase.rep_;
    ppvVar34 = pRVar6->elements;
    if (pRVar6 == (Rep *)0x0) {
      ppvVar34 = (void **)0x0;
    }
    lVar39 = (long)(pMVar13->output_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar39 != 0) {
      lVar36 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  (&local_108,*(FeatureDescription **)((long)ppvVar34 + lVar36));
        pMVar13 = pMVar10->description_;
        pMVar29 = pMVar13;
        if (pMVar13 == (ModelDescription *)0x0) {
          pMVar29 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
        }
        puVar30 = (undefined8 *)
                  ((ulong)(pMVar29->predictedfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        __n = ((undefined8 *)((ulong)local_108.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffe))[1];
        if ((__n == puVar30[1]) &&
           ((__n == 0 ||
            (iVar12 = bcmp(*(void **)((ulong)local_108.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                           (void *)*puVar30,__n), iVar12 == 0)))) {
          if (pMVar13 == (ModelDescription *)0x0) {
            uVar5 = (pMVar10->super_MessageLite)._internal_metadata_.ptr_;
            pAVar37 = (Arena *)(uVar5 & 0xfffffffffffffffc);
            if ((uVar5 & 1) != 0) {
              pAVar37 = *(Arena **)pAVar37;
            }
            pMVar13 = google::protobuf::Arena::
                      CreateMaybeMessage<CoreML::Specification::ModelDescription>(pAVar37);
            pMVar10->description_ = pMVar13;
          }
          pRVar6 = (pMVar13->traininginput_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
LAB_001df11a:
            pFVar28 = google::protobuf::Arena::
                      CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                                ((pMVar13->traininginput_).super_RepeatedPtrFieldBase.arena_);
            pFVar28 = (FeatureDescription *)
                      google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                (&(pMVar13->traininginput_).super_RepeatedPtrFieldBase,pFVar28);
          }
          else {
            iVar12 = (pMVar13->traininginput_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar6->allocated_size <= iVar12) goto LAB_001df11a;
            (pMVar13->traininginput_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
            pFVar28 = (FeatureDescription *)pRVar6->elements[iVar12];
          }
          CoreML::Specification::FeatureDescription::CopyFrom(pFVar28,&local_108);
        }
        CoreML::Specification::FeatureDescription::~FeatureDescription(&local_108);
        lVar36 = lVar36 + 8;
      } while (lVar39 * 8 != lVar36);
    }
  }
  return local_138;
}

Assistant:

Specification::NeuralNetworkClassifier* buildBasicNeuralNetworkClassifierModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, std::vector<std::string> stringClassLabels, std::vector<int64_t> intClassLabels, bool includeBias) {
    
    bool usesStringClassLabels = stringClassLabels.size() > 0;
    
    auto input = m.mutable_description()->add_input();
    auto inputType = new Specification::FeatureType;
    auto multiArray = inputType->mutable_multiarraytype();
    multiArray->mutable_shape()->Add(inTensorAttr->dimension);
    multiArray->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    input->set_name(inTensorAttr->name);
    input->set_allocated_type(inputType);
    
    auto output = m.mutable_description()->add_output();
    auto outputType = new Specification::FeatureType;
    if (usesStringClassLabels) {
        outputType->mutable_stringtype();
    } else {
        outputType->mutable_int64type();
    }
    
    output->set_name("predictedClass");
    output->set_allocated_type(outputType);
    
    output = m.mutable_description()->add_output();
    outputType = new Specification::FeatureType;
    auto dictionary = outputType->mutable_dictionarytype();
    if (usesStringClassLabels) {
        dictionary->mutable_stringkeytype();
    } else {
        dictionary->mutable_int64keytype();
    }
    
    output->set_name("classProbabilities");
    output->set_allocated_type(outputType);

    m.mutable_description()->set_predictedfeaturename("predictedClass");
    m.mutable_description()->set_predictedprobabilitiesname("classProbabilities");
    
    auto classifier = m.mutable_neuralnetworkclassifier();
    
    if (usesStringClassLabels) {
        for (auto className : stringClassLabels) {
            classifier->mutable_stringclasslabels()->add_vector(className);
        }
    } else {
        for (auto className : intClassLabels) {
            classifier->mutable_int64classlabels()->add_vector(className);
        }
    }
    
    // Add inner product layer
    auto innerProductLayer = classifier->add_layers();
    innerProductLayer->set_name("inner_product");
    innerProductLayer->add_input(inTensorAttr->name);
    innerProductLayer->add_output("intermediateOutput");
    
    uint64_t C_in = (uint64_t)inTensorAttr->dimension;
    uint64_t C_out = 0;
    
    if (usesStringClassLabels) {
        C_out = (uint64_t)stringClassLabels.size();
    } else {
        C_out = (uint64_t)intClassLabels.size();
    }
    
    auto innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(C_in);
    innerProductParams->set_outputchannels(C_out);
    
    ::google::protobuf::RepeatedField<float>* weightsWrite = innerProductParams->mutable_weights()->mutable_floatvalue();
    weightsWrite->Resize((int)C_in * (int)C_out, 0.0);
    float *destination_weights = weightsWrite->mutable_data();
    for (uint64_t i = 0; i < C_in; i++) {
        for (uint64_t j = 0; j < C_out; j++) {
            float random = float(rand())/float(RAND_MAX);
            destination_weights[i * C_out + j] = random;
        }
    }
    
    if (includeBias) {
        innerProductParams->set_hasbias(true);
        
        ::google::protobuf::RepeatedField<float>* biasWrite = innerProductParams->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize((int)1 * (int)C_out, 0.0);
        float *destination_bias = biasWrite->mutable_data();
        for (uint64_t i = 0; i < 1; i++) {
            for (uint64_t j = 0; j < C_out; j++) {
                float random = float(rand())/float(RAND_MAX);
                destination_bias[i * C_out + j] = random;
            }
        }
    }
    
    // Add inner product layer
    auto softmaxLayer = classifier->add_layers();
    softmaxLayer->set_name("softmax");
    softmaxLayer->add_input("intermediateOutput");
    softmaxLayer->add_output("scoreVector");
    softmaxLayer->mutable_softmax();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        innerProductLayer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        
        if (includeBias) {
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
        
        addCategoricalCrossEntropyLoss(m, classifier, "cross_entropy_loss", "scoreVector", "target");
        
        addLearningRate(classifier, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
        addMiniBatchSize(classifier, Specification::Optimizer::kSgdOptimizer, 32, 1, 100, {16, 32, 64, 128});
        addEpochs(classifier, 100, 1, 100, std::set<int64_t>());
        addShuffleAndSeed(classifier, 2019, 0, 2019, std::set<int64_t>());

        m.mutable_description()->clear_traininginput();
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
        for (auto feature : m.description().output()) {
            if (feature.name() == m.description().predictedfeaturename()) {
                auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
                trainingInput->CopyFrom(feature);
            }
        }
    }
    
    return classifier;
}